

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_queue.hpp
# Opt level: O0

void __thiscall
asio::detail::op_queue<asio::detail::reactor_op>::push<asio::detail::reactor_op>
          (op_queue<asio::detail::reactor_op> *this,op_queue<asio::detail::reactor_op> *q)

{
  reactor_op *o2;
  reactor_op **pprVar1;
  op_queue<asio::detail::reactor_op> *in_RSI;
  undefined8 *in_RDI;
  reactor_op *other_front;
  
  pprVar1 = op_queue_access::front<asio::detail::reactor_op>(in_RSI);
  o2 = *pprVar1;
  if (o2 != (reactor_op *)0x0) {
    if (in_RDI[1] == 0) {
      *in_RDI = o2;
    }
    else {
      op_queue_access::next<asio::detail::reactor_op,asio::detail::reactor_op>
                ((reactor_op **)(in_RDI + 1),o2);
    }
    pprVar1 = op_queue_access::back<asio::detail::reactor_op>(in_RSI);
    in_RDI[1] = *pprVar1;
    pprVar1 = op_queue_access::front<asio::detail::reactor_op>(in_RSI);
    *pprVar1 = (reactor_op *)0x0;
    pprVar1 = op_queue_access::back<asio::detail::reactor_op>(in_RSI);
    *pprVar1 = (reactor_op *)0x0;
  }
  return;
}

Assistant:

void push(op_queue<OtherOperation>& q)
  {
    if (Operation* other_front = op_queue_access::front(q))
    {
      if (back_)
        op_queue_access::next(back_, other_front);
      else
        front_ = other_front;
      back_ = op_queue_access::back(q);
      op_queue_access::front(q) = 0;
      op_queue_access::back(q) = 0;
    }
  }